

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_swift.cpp
# Opt level: O0

void __thiscall
flatbuffers::swift::SwiftGenerator::GenerateUnionTypeVerifier(SwiftGenerator *this,FieldDef *field)

{
  bool bVar1;
  char *__s;
  vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_> *pvVar2;
  reference ppEVar3;
  bool local_342;
  allocator<char> local_341;
  string local_340;
  allocator<char> local_319;
  string local_318;
  allocator<char> local_2f1;
  string local_2f0;
  byte local_2c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  allocator<char> local_281;
  string local_280;
  allocator<char> local_259;
  string local_258;
  allocator<char> local_231;
  string local_230;
  allocator<char> local_209;
  string local_208;
  allocator<char> local_1e1;
  string local_1e0;
  string local_1c0;
  allocator<char> local_199;
  string local_198;
  undefined1 local_178 [8];
  string type;
  EnumVal *ev;
  __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
  local_148;
  const_iterator it;
  string local_138;
  allocator<char> local_111;
  string local_110;
  allocator<char> local_e9;
  string local_e8;
  allocator<char> local_c1;
  string local_c0;
  string local_a0;
  allocator<char> local_69;
  string local_68;
  EnumDef *local_48;
  EnumDef *union_def;
  bool local_19;
  FieldDef *pFStack_18;
  bool is_vector;
  FieldDef *field_local;
  SwiftGenerator *this_local;
  
  pFStack_18 = field;
  field_local = (FieldDef *)this;
  bVar1 = IsVector(&(field->value).type);
  local_342 = true;
  if (!bVar1) {
    local_342 = IsArray(&(pFStack_18->value).type);
  }
  local_19 = local_342;
  bVar1 = true;
  if (((pFStack_18->value).type.base_type != BASE_TYPE_UTYPE) && (bVar1 = false, local_342 != false)
     ) {
    Type::VectorType((Type *)&union_def,&(pFStack_18->value).type);
    bVar1 = (int)union_def == 1;
  }
  if (!bVar1) {
    local_48 = (pFStack_18->value).type.enum_def;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"VALUETYPE",&local_69);
    IdlNamer::NamespacedType_abi_cxx11_(&local_a0,&this->namer_,&local_48->super_Definition);
    CodeWriter::SetValue(&this->code_,&local_68,&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_68);
    std::allocator<char>::~allocator(&local_69);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c0,"FUNCTION_NAME",&local_c1);
    __s = "visit";
    if ((local_19 & 1U) != 0) {
      __s = "visitUnionVector";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,__s,&local_e9);
    CodeWriter::SetValue(&this->code_,&local_c0,&local_e8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::allocator<char>::~allocator(&local_e9);
    std::__cxx11::string::~string((string *)&local_c0);
    std::allocator<char>::~allocator(&local_c1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_110,
               "try _v.{{FUNCTION_NAME}}(unionKey: {{TABLEOFFSET}}.{{OFFSET}}Type.p, unionField: {{TABLEOFFSET}}.{{OFFSET}}.p, unionKeyName: \"{{FIELDVAR}}Type\", fieldName: \"{{FIELDVAR}}\", required: {{ISREQUIRED}}, completion: { (verifier, key: {{VALUETYPE}}, pos) in"
               ,&local_111);
    CodeWriter::operator+=(&this->code_,&local_110);
    std::__cxx11::string::~string((string *)&local_110);
    std::allocator<char>::~allocator(&local_111);
    Indent(this);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_138,"switch key {",(allocator<char> *)((long)&it._M_current + 7));
    CodeWriter::operator+=(&this->code_,&local_138);
    std::__cxx11::string::~string((string *)&local_138);
    std::allocator<char>::~allocator((allocator<char> *)((long)&it._M_current + 7));
    pvVar2 = EnumDef::Vals(local_48);
    local_148._M_current =
         (EnumVal **)
         std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::begin(pvVar2)
    ;
    while( true ) {
      pvVar2 = EnumDef::Vals(local_48);
      ev = (EnumVal *)
           std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::end(pvVar2)
      ;
      bVar1 = __gnu_cxx::operator!=
                        (&local_148,
                         (__normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
                          *)&ev);
      if (!bVar1) break;
      ppEVar3 = __gnu_cxx::
                __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
                ::operator*(&local_148);
      type.field_2._8_8_ = *ppEVar3;
      GenType_abi_cxx11_((string *)local_178,this,&((EnumVal *)type.field_2._8_8_)->union_type,false
                        );
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_198,"KEY",&local_199);
      IdlNamer::LegacySwiftVariant_abi_cxx11_
                (&local_1c0,&this->namer_,(EnumVal *)type.field_2._8_8_);
      CodeWriter::SetValue(&this->code_,&local_198,&local_1c0);
      std::__cxx11::string::~string((string *)&local_1c0);
      std::__cxx11::string::~string((string *)&local_198);
      std::allocator<char>::~allocator(&local_199);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1e0,"VALUETYPE",&local_1e1);
      CodeWriter::SetValue(&this->code_,&local_1e0,(string *)local_178);
      std::__cxx11::string::~string((string *)&local_1e0);
      std::allocator<char>::~allocator(&local_1e1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_208,"case .{{KEY}}:",&local_209);
      CodeWriter::operator+=(&this->code_,&local_208);
      std::__cxx11::string::~string((string *)&local_208);
      std::allocator<char>::~allocator(&local_209);
      Indent(this);
      if (*(int *)(type.field_2._8_8_ + 0x38) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_230,"break // NOTE - SWIFT doesnt support none",&local_231);
        CodeWriter::operator+=(&this->code_,&local_230);
        std::__cxx11::string::~string((string *)&local_230);
        std::allocator<char>::~allocator(&local_231);
      }
      else if (*(int *)(type.field_2._8_8_ + 0x38) == 0xd) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_258,
                   "try ForwardOffset<String>.verify(&verifier, at: pos, of: String.self)",
                   &local_259);
        CodeWriter::operator+=(&this->code_,&local_258);
        std::__cxx11::string::~string((string *)&local_258);
        std::allocator<char>::~allocator(&local_259);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_280,"MAINTYPE",&local_281);
        local_2c9 = 0;
        if ((*(byte *)(*(long *)(type.field_2._8_8_ + 0x40) + 0x110) & 1) == 0) {
          std::operator+(&local_2c8,"ForwardOffset<",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_178);
          local_2c9 = 1;
          std::operator+(&local_2a8,&local_2c8,">");
        }
        else {
          std::__cxx11::string::string((string *)&local_2a8,(string *)local_178);
        }
        CodeWriter::SetValue(&this->code_,&local_280,&local_2a8);
        std::__cxx11::string::~string((string *)&local_2a8);
        if ((local_2c9 & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_2c8);
        }
        std::__cxx11::string::~string((string *)&local_280);
        std::allocator<char>::~allocator(&local_281);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2f0,
                   "try {{MAINTYPE}}.verify(&verifier, at: pos, of: {{VALUETYPE}}.self)",&local_2f1)
        ;
        CodeWriter::operator+=(&this->code_,&local_2f0);
        std::__cxx11::string::~string((string *)&local_2f0);
        std::allocator<char>::~allocator(&local_2f1);
      }
      Outdent(this);
      std::__cxx11::string::~string((string *)local_178);
      __gnu_cxx::
      __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
      ::operator++(&local_148);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_318,"}",&local_319);
    CodeWriter::operator+=(&this->code_,&local_318);
    std::__cxx11::string::~string((string *)&local_318);
    std::allocator<char>::~allocator(&local_319);
    Outdent(this);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_340,"})",&local_341);
    CodeWriter::operator+=(&this->code_,&local_340);
    std::__cxx11::string::~string((string *)&local_340);
    std::allocator<char>::~allocator(&local_341);
  }
  return;
}

Assistant:

void GenerateUnionTypeVerifier(const FieldDef &field) {
    const auto is_vector =
        IsVector(field.value.type) || IsArray(field.value.type);
    if (field.value.type.base_type == BASE_TYPE_UTYPE ||
        (is_vector &&
         field.value.type.VectorType().base_type == BASE_TYPE_UTYPE))
      return;
    EnumDef &union_def = *field.value.type.enum_def;
    code_.SetValue("VALUETYPE", namer_.NamespacedType(union_def));
    code_.SetValue("FUNCTION_NAME", is_vector ? "visitUnionVector" : "visit");
    code_ +=
        "try _v.{{FUNCTION_NAME}}(unionKey: {{TABLEOFFSET}}.{{OFFSET}}Type.p, "
        "unionField: {{TABLEOFFSET}}.{{OFFSET}}.p, unionKeyName: "
        "\"{{FIELDVAR}}Type\", fieldName: \"{{FIELDVAR}}\", required: "
        "{{ISREQUIRED}}, completion: { (verifier, key: {{VALUETYPE}}, pos) in";
    Indent();
    code_ += "switch key {";
    for (auto it = union_def.Vals().begin(); it != union_def.Vals().end();
         ++it) {
      const auto &ev = **it;
      const auto type = GenType(ev.union_type);
      code_.SetValue("KEY", namer_.LegacySwiftVariant(ev));
      code_.SetValue("VALUETYPE", type);
      code_ += "case .{{KEY}}:";
      Indent();
      if (ev.union_type.base_type == BASE_TYPE_NONE) {
        code_ += "break // NOTE - SWIFT doesnt support none";
      } else if (ev.union_type.base_type == BASE_TYPE_STRING) {
        code_ +=
            "try ForwardOffset<String>.verify(&verifier, at: pos, of: "
            "String.self)";
      } else {
        code_.SetValue("MAINTYPE", ev.union_type.struct_def->fixed
                                       ? type
                                       : "ForwardOffset<" + type + ">");
        code_ +=
            "try {{MAINTYPE}}.verify(&verifier, at: pos, of: "
            "{{VALUETYPE}}.self)";
      }
      Outdent();
    }
    code_ += "}";
    Outdent();
    code_ += "})";
  }